

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineGLImplTraits>::BeginRenderPass
          (DeviceContextBase<Diligent::EngineGLImplTraits> *this,BeginRenderPassAttribs *Attribs)

{
  String *__return_storage_ptr__;
  long *plVar1;
  bool bVar2;
  COMMAND_QUEUE_TYPE CVar3;
  bool bVar4;
  Char *pCVar5;
  RenderPassGLImpl *pRVar6;
  DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
  *pDVar7;
  RenderPassDesc *pRVar8;
  FramebufferGLImpl *pFVar9;
  FramebufferDesc *Args;
  RenderDeviceGLImpl *this_00;
  RenderDeviceInfo *this_01;
  long lVar10;
  ITexture *Ptr;
  TextureBaseGL *Texture;
  COMMAND_QUEUE_TYPE Type;
  char *in_R8;
  char (*in_R9) [8];
  char (*in_stack_fffffffffffffe48) [2];
  undefined1 local_178 [8];
  StateTransitionDesc Barrier;
  RESOURCE_STATE RequiredState;
  TextureImplType *pTex;
  ITextureView *pView;
  Uint32 i;
  bool IsMetal;
  string msg_5;
  FramebufferDesc *FBDesc;
  RenderPassDesc *RPDesc;
  FramebufferImplType *pNewFramebuffer;
  RenderPassImplType *pNewRenderPass;
  string msg_4;
  string msg_3;
  undefined1 local_88 [8];
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  BeginRenderPassAttribs *Attribs_local;
  DeviceContextBase<Diligent::EngineGLImplTraits> *this_local;
  
  msg.field_2._8_8_ = Attribs;
  if ((this->m_Desc).QueueType == COMMAND_QUEUE_TYPE_UNKNOWN) {
    bVar2 = IsDeferred(this);
    if (!bVar2) {
      FormatString<char[79]>
                ((string *)local_38,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"BeginRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5b8);
      std::__cxx11::string::~string((string *)local_38);
    }
    FormatString<char[97]>
              ((string *)((long)&msg_2.field_2 + 8),
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5b8);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  CVar3 = Diligent::operator&((this->m_Desc).QueueType,COMMAND_QUEUE_TYPE_GRAPHICS);
  if (CVar3 != COMMAND_QUEUE_TYPE_GRAPHICS) {
    __return_storage_ptr__ = (String *)((long)&msg_3.field_2 + 8);
    GetCommandQueueTypeString_abi_cxx11_
              (__return_storage_ptr__,(Diligent *)(ulong)(this->m_Desc).QueueType,Type);
    in_R8 = " queue.";
    FormatString<char[16],char[22],std::__cxx11::string,char[8]>
              ((string *)local_88,(Diligent *)"BeginRenderPass",(char (*) [16])0x48656c,
               (char (*) [22])__return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)(msg_3.field_2._M_local_buf + 8));
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5b8);
    std::__cxx11::string::~string((string *)local_88);
  }
  pRVar6 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassGLImpl_
                     ((RefCntAutoPtr *)&this->m_pActiveRenderPass);
  if (pRVar6 != (RenderPassGLImpl *)0x0) {
    pDVar7 = (DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
              *)RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator->(&this->m_pActiveRenderPass);
    pRVar8 = DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
             ::GetDesc(pDVar7);
    FormatString<char[61],char_const*,char[14]>
              ((string *)((long)&msg_4.field_2 + 8),
               (Diligent *)"Attempting to begin render pass while another render pass (\'",
               (char (*) [61])pRVar8,(char **)"\') is active.",(char (*) [14])in_R8);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5b9);
    std::__cxx11::string::~string((string *)(msg_4.field_2._M_local_buf + 8));
  }
  pFVar9 = Diligent::RefCntAutoPtr::operator_cast_to_FramebufferGLImpl_
                     ((RefCntAutoPtr *)&this->m_pBoundFramebuffer);
  if (pFVar9 != (FramebufferGLImpl *)0x0) {
    pFVar9 = RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator->(&this->m_pBoundFramebuffer);
    Args = DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
           ::GetDesc((DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                      *)pFVar9);
    FormatString<char[61],char_const*,char[13]>
              ((string *)&pNewRenderPass,
               (Diligent *)"Attempting to begin render pass while another framebuffer (\'",
               (char (*) [61])Args,(char **)"\') is bound.",(char (*) [13])in_R8);
    pCVar5 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar5,"BeginRenderPass",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x5ba);
    std::__cxx11::string::~string((string *)&pNewRenderPass);
  }
  VerifyBeginRenderPassAttribs((BeginRenderPassAttribs *)msg.field_2._8_8_);
  (*(this->super_ObjectBase<Diligent::IDeviceContextGL>).
    super_RefCountedObject<Diligent::IDeviceContextGL>.super_IDeviceContextGL.super_IDeviceContext.
    super_IObject._vptr_IObject[0x51])();
  pDVar7 = (DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
            *)ClassPtrCast<Diligent::RenderPassGLImpl,Diligent::IRenderPass>
                        (*(IRenderPass **)msg.field_2._8_8_);
  pFVar9 = ClassPtrCast<Diligent::FramebufferGLImpl,Diligent::IFramebuffer>
                     (*(IFramebuffer **)(msg.field_2._8_8_ + 8));
  if (*(char *)(msg.field_2._8_8_ + 0x20) != '\0') {
    pRVar8 = DeviceObjectBase<Diligent::IRenderPass,_Diligent::RenderDeviceGLImpl,_Diligent::RenderPassDesc>
             ::GetDesc(pDVar7);
    msg_5.field_2._8_8_ =
         DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
         ::GetDesc((DeviceObjectBase<Diligent::IFramebuffer,_Diligent::RenderDeviceGLImpl,_Diligent::FramebufferDesc>
                    *)pFVar9);
    if (((FramebufferDesc *)msg_5.field_2._8_8_)->AttachmentCount < pRVar8->AttachmentCount) {
      FormatString<char[28],unsigned_int,char[96],unsigned_int,char[2]>
                ((string *)&i,(Diligent *)"The number of attachments (",
                 (char (*) [28])&((FramebufferDesc *)msg_5.field_2._8_8_)->AttachmentCount,
                 (uint *)
                 ") in currently bound framebuffer is smaller than the number of attachments in the render pass ("
                 ,(char (*) [96])&pRVar8->AttachmentCount,(uint *)0x46d916,in_stack_fffffffffffffe48
                );
      pCVar5 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar5,"BeginRenderPass",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x5c9);
      std::__cxx11::string::~string((string *)&i);
    }
    this_00 = RefCntAutoPtr<Diligent::RenderDeviceGLImpl>::operator->(&this->m_pDevice);
    this_01 = RenderDeviceBase<Diligent::EngineGLImplTraits>::GetDeviceInfo
                        (&this_00->super_RenderDeviceBase<Diligent::EngineGLImplTraits>);
    bVar2 = RenderDeviceInfo::IsMetalDevice(this_01);
    for (pView._0_4_ = 0; (uint)pView < *(uint *)(msg_5.field_2._8_8_ + 0x10);
        pView._0_4_ = (uint)pView + 1) {
      plVar1 = *(long **)(*(long *)(msg_5.field_2._8_8_ + 0x18) + (ulong)(uint)pView * 8);
      if ((plVar1 != (long *)0x0) &&
         ((!bVar2 || (lVar10 = (**(code **)(*plVar1 + 0x20))(), *(char *)(lVar10 + 8) != '\x06'))))
      {
        Ptr = (ITexture *)(**(code **)(*plVar1 + 0x50))();
        Texture = ClassPtrCast<Diligent::TextureBaseGL,Diligent::ITexture>(Ptr);
        Barrier._44_4_ = pRVar8->pAttachments[(uint)pView].InitialState;
        if (*(char *)(msg.field_2._8_8_ + 0x20) == '\x01') {
          bVar4 = TextureBase<Diligent::EngineGLImplTraits>::IsInKnownState
                            (&Texture->super_TextureBase<Diligent::EngineGLImplTraits>);
          if ((bVar4) &&
             (bVar4 = TextureBase<Diligent::EngineGLImplTraits>::CheckState
                                (&Texture->super_TextureBase<Diligent::EngineGLImplTraits>,
                                 Barrier._44_4_), !bVar4)) {
            StateTransitionDesc::StateTransitionDesc
                      ((StateTransitionDesc *)local_178,(ITexture *)Texture,RESOURCE_STATE_UNKNOWN,
                       Barrier._44_4_,STATE_TRANSITION_FLAG_UPDATE_STATE);
            (*(this->super_ObjectBase<Diligent::IDeviceContextGL>).
              super_RefCountedObject<Diligent::IDeviceContextGL>.super_IDeviceContextGL.
              super_IDeviceContext.super_IObject._vptr_IObject[0x36])(this,1,local_178);
          }
        }
        else if (*(char *)(msg.field_2._8_8_ + 0x20) == '\x02') {
          DvpVerifyTextureState(this,Texture,Barrier._44_4_,"BeginRenderPass");
        }
      }
    }
  }
  RefCntAutoPtr<Diligent::RenderPassGLImpl>::operator=
            (&this->m_pActiveRenderPass,(RenderPassGLImpl *)pDVar7);
  RefCntAutoPtr<Diligent::FramebufferGLImpl>::operator=(&this->m_pBoundFramebuffer,pFVar9);
  this->m_SubpassIndex = 0;
  this->m_RenderPassAttachmentsTransitionMode =
       *(RESOURCE_STATE_TRANSITION_MODE *)(msg.field_2._8_8_ + 0x20);
  UpdateAttachmentStates(this,this->m_SubpassIndex);
  SetSubpassRenderTargets(this);
  return;
}

Assistant:

inline void DeviceContextBase<ImplementationTraits>::BeginRenderPass(const BeginRenderPassAttribs& Attribs)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_GRAPHICS, "BeginRenderPass");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Attempting to begin render pass while another render pass ('", m_pActiveRenderPass->GetDesc().Name, "') is active.");
    DEV_CHECK_ERR(m_pBoundFramebuffer == nullptr, "Attempting to begin render pass while another framebuffer ('", m_pBoundFramebuffer->GetDesc().Name, "') is bound.");

    VerifyBeginRenderPassAttribs(Attribs);

    // Reset current render targets (in Vulkan backend, this may end current render pass).
    ResetRenderTargets();

    RenderPassImplType*  pNewRenderPass  = ClassPtrCast<RenderPassImplType>(Attribs.pRenderPass);
    FramebufferImplType* pNewFramebuffer = ClassPtrCast<FramebufferImplType>(Attribs.pFramebuffer);
    if (Attribs.StateTransitionMode != RESOURCE_STATE_TRANSITION_MODE_NONE)
    {
        const RenderPassDesc&  RPDesc = pNewRenderPass->GetDesc();
        const FramebufferDesc& FBDesc = pNewFramebuffer->GetDesc();
        DEV_CHECK_ERR(RPDesc.AttachmentCount <= FBDesc.AttachmentCount,
                      "The number of attachments (", FBDesc.AttachmentCount,
                      ") in currently bound framebuffer is smaller than the number of attachments in the render pass (", RPDesc.AttachmentCount, ")");
        const bool IsMetal = m_pDevice->GetDeviceInfo().IsMetalDevice();
        for (Uint32 i = 0; i < FBDesc.AttachmentCount; ++i)
        {
            ITextureView* pView = FBDesc.ppAttachments[i];
            if (pView == nullptr)
                continue;

            if (IsMetal && pView->GetDesc().ViewType == TEXTURE_VIEW_SHADING_RATE)
                continue;

            TextureImplType* pTex          = ClassPtrCast<TextureImplType>(pView->GetTexture());
            RESOURCE_STATE   RequiredState = RPDesc.pAttachments[i].InitialState;
            if (Attribs.StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
            {
                if (pTex->IsInKnownState() && !pTex->CheckState(RequiredState))
                {
                    StateTransitionDesc Barrier{pTex, RESOURCE_STATE_UNKNOWN, RequiredState, STATE_TRANSITION_FLAG_UPDATE_STATE};
                    this->TransitionResourceStates(1, &Barrier);
                }
            }
            else if (Attribs.StateTransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY)
            {
                DvpVerifyTextureState(*pTex, RequiredState, "BeginRenderPass");
            }
        }
    }

    m_pActiveRenderPass                   = pNewRenderPass;
    m_pBoundFramebuffer                   = pNewFramebuffer;
    m_SubpassIndex                        = 0;
    m_RenderPassAttachmentsTransitionMode = Attribs.StateTransitionMode;

    UpdateAttachmentStates(m_SubpassIndex);
    SetSubpassRenderTargets();
}